

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O3

void __thiscall
QCalendarPopup::QCalendarPopup
          (QCalendarPopup *this,QWidget *parent,QCalendarWidget *cw,undefined8 param_4)

{
  QWidget::QWidget(&this->super_QWidget,parent,(WindowFlags)0x9);
  *(undefined ***)&this->super_QWidget = &PTR_metaObject_007f1750;
  *(undefined ***)&(this->super_QWidget).super_QPaintDevice = &PTR__QCalendarPopup_007f1900;
  (this->calendar).wp.d = (Data *)0x0;
  (this->calendar).wp.value = (QObject *)0x0;
  (this->oldDate).jd = -0x8000000000000000;
  *(undefined8 *)&this->calendarSystem = param_4;
  QWidget::setAttribute(&this->super_QWidget,WA_WindowPropagation,true);
  this->dateChanged = false;
  if (cw != (QCalendarWidget *)0x0) {
    setCalendarWidget(this,cw);
    return;
  }
  verifyCalendarInstance(this);
  return;
}

Assistant:

QCalendarPopup::QCalendarPopup(QWidget *parent, QCalendarWidget *cw, QCalendar ca)
    : QWidget(parent, Qt::Popup), calendarSystem(ca)
{
    setAttribute(Qt::WA_WindowPropagation);

    dateChanged = false;
    if (!cw) {
        verifyCalendarInstance();
    } else {
        setCalendarWidget(cw);
    }
}